

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

void addGoToRecord(xformDatabase *xdb,char *rec)

{
  double dVar1;
  goToRec *pgVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  if (rec != (char *)0x0 && xdb != (xformDatabase *)0x0) {
    pgVar2 = (goToRec *)malloc(0x48);
    if (pgVar2 == (goToRec *)0x0) {
      warn("could not create \'go to\' record");
      return;
    }
    pgVar2->level[5] = 0.0;
    pgVar2->level[6] = 0.0;
    pgVar2->level[3] = 0.0;
    pgVar2->level[4] = 0.0;
    pgVar2->level[1] = 0.0;
    pgVar2->level[2] = 0.0;
    pgVar2->next = (goToRec_t *)0x0;
    pgVar2->level[0] = 0.0;
    pgVar2->level[7] = 0.0;
    if (xdb->golist == (goToRec *)0x0) {
      xdb->golist = pgVar2;
    }
    if (xdb->glast != (goToRec *)0x0) {
      xdb->glast->next = pgVar2;
    }
    xdb->glast = pgVar2;
    pcVar3 = strtok(rec,":");
    if ((pcVar3 != (char *)0x0) && (pcVar3 = strtok((char *)0x0,":"), pcVar3 != (char *)0x0)) {
      uVar4 = 0;
      do {
        dVar1 = atof(pcVar3);
        pgVar2->level[uVar4] = dVar1;
        pcVar3 = strtok((char *)0x0,":");
        if (pcVar3 == (char *)0x0) {
          return;
        }
        bVar5 = uVar4 < 7;
        uVar4 = uVar4 + 1;
      } while (bVar5);
    }
  }
  return;
}

Assistant:

void addGoToRecord(xformDatabase* xdb, char *rec) {
   char *p = NULL;
   int i = 0;
   goToRec* g = NULL;

   if (xdb && rec) {
      g = (goToRec *)malloc(sizeof(goToRec));
      if (!g) {
         warn("could not create 'go to' record");
         return;
      }

      /* initialize */
      g->next = NULL;
      for(i = 0; i < MAX_XFORM_LEVELS; i++) {
         g->level[i] = 0.0;
      }

      if (! xdb->golist) { xdb->golist = g; }
      if (xdb->glast) { xdb->glast->next = g; }
      xdb->glast = g;

      p = strtok(rec, XFORMREC_DELIM); /* type id */
      if (p) {
	 p = strtok(NULL, XFORMREC_DELIM);
	 for(i=0; p && (i < MAX_XFORM_LEVELS); i++) {
	    g->level[i] = atof(p);
	    p = strtok(NULL, XFORMREC_DELIM);
	 }
      }
   }
}